

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::crate::CrateReader::ReadSpecs(CrateReader *this)

{
  vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_> *this_00;
  long lVar1;
  pointer pSVar2;
  StreamReader *this_01;
  _Alloc_hider _Var3;
  bool bVar4;
  ostream *poVar5;
  ulong uVar6;
  size_t __new_size;
  size_t __new_size_00;
  pointer pcVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pSVar11;
  Index *pIVar12;
  SpecType *pSVar13;
  int iVar14;
  size_t i;
  char *pcVar15;
  string err;
  uint64_t num_specs;
  uint64_t path_indexes_size;
  vector<char,_std::allocator<char>_> comp_buffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  vector<char,_std::allocator<char>_> working_space;
  ostringstream ss_e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  ostringstream local_1c8 [376];
  string local_50;
  
  lVar1 = this->_specs_index;
  if ((lVar1 < 0) ||
     (pSVar2 = (this->_toc).sections.
               super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (long)(this->_toc).sections.
           super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>.
           _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 5 <= lVar1)) {
    ::std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x173e);
    ::std::operator<<(poVar5," ");
    pcVar15 = "Invalid index for `SPECS` section.";
    goto LAB_00187690;
  }
  if ((this->_version[0] == '\0') && (this->_version[1] < 4)) {
    ::std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1745);
    ::std::operator<<(poVar5," ");
    ::std::__cxx11::to_string(&local_288,(uint)this->_version[0]);
    ::std::operator+(&local_208,"Version must be 0.4.0 or later, but got ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_288
                    );
    ::std::operator+(&local_228,&local_208,".");
    ::std::__cxx11::to_string(&local_268,(uint)this->_version[1]);
    ::std::operator+(&local_248,&local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_268
                    );
    ::std::operator+(&local_1e8,&local_248,".");
    ::std::__cxx11::to_string(&local_50,(uint)this->_version[2]);
    ::std::operator+(&local_2a8,&local_1e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50)
    ;
    poVar5 = ::std::operator<<((ostream *)local_1c8,(string *)&local_2a8);
    ::std::operator<<(poVar5,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    goto LAB_001876d7;
  }
  this_01 = this->_sr;
  uVar6 = pSVar2[lVar1].start;
  if (this_01->length_ < uVar6) {
    ::std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x174c);
    ::std::operator<<(poVar5," ");
    pcVar15 = "Failed to move to `SPECS` section.";
  }
  else {
    this_01->idx_ = uVar6;
    bVar4 = StreamReader::read8(this_01,(uint64_t *)&local_288);
    if (bVar4) {
      if ((pointer)(this->_config).maxNumSpecifiers < local_288._M_dataplus._M_p) {
        ::std::__cxx11::ostringstream::ostringstream(local_1c8);
        poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1757);
        ::std::operator<<(poVar5," ");
        pcVar15 = "Too many specs in `SPECS` section.";
      }
      else if (local_288._M_dataplus._M_p == (pointer)0x0) {
        ::std::__cxx11::ostringstream::ostringstream(local_1c8);
        poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x175d);
        ::std::operator<<(poVar5," ");
        pcVar15 = "`SPECS` is empty.";
      }
      else {
        uVar6 = (long)local_288._M_dataplus._M_p * 0xc + this->_memoryUsage;
        this->_memoryUsage = uVar6;
        if ((this->_config).maxMemoryBudget < uVar6) {
          ::std::__cxx11::ostringstream::ostringstream(local_1c8);
          poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
          poVar5 = ::std::operator<<(poVar5,"():");
          iVar14 = 0x1763;
        }
        else {
          this_00 = &this->_specs;
          ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::resize
                    (this_00,(size_type)local_288._M_dataplus._M_p);
          __new_size = Usd_IntegerCompression::GetCompressedBufferSize
                                 ((size_t)local_288._M_dataplus._M_p);
          uVar6 = this->_memoryUsage + __new_size;
          this->_memoryUsage = uVar6;
          if (uVar6 <= (this->_config).maxMemoryBudget) {
            local_248._M_dataplus._M_p = (char *)0x0;
            local_248._M_string_length = 0;
            local_248.field_2._M_allocated_capacity = 0;
            ::std::vector<char,_std::allocator<char>_>::resize
                      ((vector<char,_std::allocator<char>_> *)&local_248,__new_size);
            uVar6 = (long)local_288._M_dataplus._M_p * 4 + this->_memoryUsage;
            this->_memoryUsage = uVar6;
            if ((this->_config).maxMemoryBudget < uVar6) {
              ::std::__cxx11::ostringstream::ostringstream(local_1c8);
              poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,"[Crate]");
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1772);
              ::std::operator<<(poVar5," ");
              poVar5 = ::std::operator<<((ostream *)local_1c8,"Reached to max memory budget.");
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::append((string *)&this->_err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
              bVar4 = false;
              goto LAB_00188489;
            }
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_228,
                       (size_type)local_288._M_dataplus._M_p,(allocator_type *)local_1c8);
            __new_size_00 =
                 Usd_IntegerCompression::GetDecompressionWorkingSpaceSize
                           ((size_t)local_288._M_dataplus._M_p);
            uVar6 = this->_memoryUsage + __new_size_00;
            this->_memoryUsage = uVar6;
            if ((this->_config).maxMemoryBudget < uVar6) {
              ::std::__cxx11::ostringstream::ostringstream(local_1c8);
              poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,"[Crate]");
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1779);
              ::std::operator<<(poVar5," ");
              poVar5 = ::std::operator<<((ostream *)local_1c8,"Reached to max memory budget.");
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::append((string *)&this->_err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
              bVar4 = false;
            }
            else {
              local_208._M_dataplus._M_p = (char *)0x0;
              local_208._M_string_length = 0;
              local_208.field_2._M_allocated_capacity = 0;
              ::std::vector<char,_std::allocator<char>_>::resize
                        ((vector<char,_std::allocator<char>_> *)&local_208,__new_size_00);
              bVar4 = StreamReader::read8(this->_sr,(uint64_t *)&local_268);
              if (bVar4) {
                if ((pointer)(local_248._M_string_length - (long)local_248._M_dataplus._M_p) <
                    local_268._M_dataplus._M_p) {
                  local_268._M_dataplus._M_p =
                       (pointer)(local_248._M_string_length - (long)local_248._M_dataplus._M_p);
                }
                _Var3._M_p = local_268._M_dataplus._M_p;
                pcVar7 = (pointer)StreamReader::read(this->_sr,(int)local_268._M_dataplus._M_p,
                                                     local_268._M_dataplus._M_p,
                                                     (size_t)local_248._M_dataplus._M_p);
                if (_Var3._M_p != pcVar7) {
                  ::std::__cxx11::ostringstream::ostringstream(local_1c8);
                  poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
                  poVar5 = ::std::operator<<(poVar5,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar5 = ::std::operator<<(poVar5,":");
                  poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
                  poVar5 = ::std::operator<<(poVar5,"():");
                  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x178d);
                  ::std::operator<<(poVar5," ");
                  pcVar15 = "Failed to read path indexes data at `SPECS` section.";
                  goto LAB_00188421;
                }
                local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
                local_2a8._M_string_length = 0;
                local_2a8.field_2._M_local_buf[0] = '\0';
                sVar8 = Usd_IntegerCompression::DecompressFromBuffer
                                  (local_248._M_dataplus._M_p,(size_t)local_268._M_dataplus._M_p,
                                   (uint32_t *)local_228._M_dataplus._M_p,
                                   (size_t)local_288._M_dataplus._M_p,(string *)&local_2a8,
                                   local_208._M_dataplus._M_p);
                if (sVar8 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream(local_1c8);
                  poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
                  poVar5 = ::std::operator<<(poVar5,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar5 = ::std::operator<<(poVar5,":");
                  poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
                  poVar5 = ::std::operator<<(poVar5,"():");
                  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1795);
                  ::std::operator<<(poVar5," ");
                  poVar5 = ::std::operator<<((ostream *)local_1c8,
                                             "Failed to decode pathIndexes at `SPECS` section.");
                  ::std::operator<<(poVar5,"\n");
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::append((string *)&this->_err);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
                }
                else {
                  pSVar11 = (this_00->
                            super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  for (pcVar7 = (pointer)0x0; local_288._M_dataplus._M_p != pcVar7;
                      pcVar7 = pcVar7 + 1) {
                    (pSVar11->path_index).value =
                         *(uint32_t *)(local_228._M_dataplus._M_p + (long)pcVar7 * 4);
                    pSVar11 = pSVar11 + 1;
                  }
                }
                ::std::__cxx11::string::_M_dispose();
                if (sVar8 == 0) goto LAB_0018846d;
                bVar4 = StreamReader::read8(this->_sr,(uint64_t *)&local_268);
                if (!bVar4) {
                  ::std::__cxx11::ostringstream::ostringstream(local_1c8);
                  poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
                  poVar5 = ::std::operator<<(poVar5,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar5 = ::std::operator<<(poVar5,":");
                  poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
                  poVar5 = ::std::operator<<(poVar5,"():");
                  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x17a3);
                  ::std::operator<<(poVar5," ");
                  pcVar15 = "Failed to read fieldset indexes size at `SPECS` section.";
                  goto LAB_00188421;
                }
                if ((pointer)(local_248._M_string_length - (long)local_248._M_dataplus._M_p) <
                    local_268._M_dataplus._M_p) {
                  local_268._M_dataplus._M_p =
                       (pointer)(local_248._M_string_length - (long)local_248._M_dataplus._M_p);
                }
                _Var3._M_p = local_268._M_dataplus._M_p;
                pcVar7 = (pointer)StreamReader::read(this->_sr,(int)local_268._M_dataplus._M_p,
                                                     local_268._M_dataplus._M_p,
                                                     (size_t)local_248._M_dataplus._M_p);
                if (_Var3._M_p != pcVar7) {
                  ::std::__cxx11::ostringstream::ostringstream(local_1c8);
                  poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
                  poVar5 = ::std::operator<<(poVar5,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar5 = ::std::operator<<(poVar5,":");
                  poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
                  poVar5 = ::std::operator<<(poVar5,"():");
                  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x17af);
                  ::std::operator<<(poVar5," ");
                  pcVar15 = "Failed to read fieldset indexes data at `SPECS` section.";
                  goto LAB_00188421;
                }
                local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
                local_2a8._M_string_length = 0;
                local_2a8.field_2._M_local_buf[0] = '\0';
                sVar8 = Usd_IntegerCompression::DecompressFromBuffer
                                  (local_248._M_dataplus._M_p,(size_t)local_268._M_dataplus._M_p,
                                   (uint32_t *)local_228._M_dataplus._M_p,
                                   (size_t)local_288._M_dataplus._M_p,(string *)&local_2a8,
                                   local_208._M_dataplus._M_p);
                if (sVar8 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream(local_1c8);
                  poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
                  poVar5 = ::std::operator<<(poVar5,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar5 = ::std::operator<<(poVar5,":");
                  poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
                  poVar5 = ::std::operator<<(poVar5,"():");
                  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x17b7);
                  ::std::operator<<(poVar5," ");
                  poVar5 = ::std::operator<<((ostream *)local_1c8,
                                             "Failed to decode fieldset indices at `SPECS` section."
                                            );
                  ::std::operator<<(poVar5,"\n");
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::append((string *)&this->_err);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
                }
                else {
                  pIVar12 = &((this_00->
                              super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                              )._M_impl.super__Vector_impl_data._M_start)->fieldset_index;
                  for (pcVar7 = (pointer)0x0; local_288._M_dataplus._M_p != pcVar7;
                      pcVar7 = pcVar7 + 1) {
                    pIVar12->value = *(uint32_t *)(local_228._M_dataplus._M_p + (long)pcVar7 * 4);
                    pIVar12 = pIVar12 + 3;
                  }
                }
                ::std::__cxx11::string::_M_dispose();
                if (sVar8 == 0) goto LAB_0018846d;
                bVar4 = StreamReader::read8(this->_sr,(uint64_t *)&local_268);
                if (!bVar4) {
                  ::std::__cxx11::ostringstream::ostringstream(local_1c8);
                  poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
                  poVar5 = ::std::operator<<(poVar5,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar5 = ::std::operator<<(poVar5,":");
                  poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
                  poVar5 = ::std::operator<<(poVar5,"():");
                  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x17c5);
                  ::std::operator<<(poVar5," ");
                  pcVar15 = "Failed to read spectype size at `SPECS` section.";
                  goto LAB_00188421;
                }
                if ((pointer)(local_248._M_string_length - (long)local_248._M_dataplus._M_p) <
                    local_268._M_dataplus._M_p) {
                  local_268._M_dataplus._M_p =
                       (pointer)(local_248._M_string_length - (long)local_248._M_dataplus._M_p);
                }
                _Var3._M_p = local_268._M_dataplus._M_p;
                pcVar7 = (pointer)StreamReader::read(this->_sr,(int)local_268._M_dataplus._M_p,
                                                     local_268._M_dataplus._M_p,
                                                     (size_t)local_248._M_dataplus._M_p);
                if (_Var3._M_p != pcVar7) {
                  ::std::__cxx11::ostringstream::ostringstream(local_1c8);
                  poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
                  poVar5 = ::std::operator<<(poVar5,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar5 = ::std::operator<<(poVar5,":");
                  poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
                  poVar5 = ::std::operator<<(poVar5,"():");
                  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x17d1);
                  ::std::operator<<(poVar5," ");
                  pcVar15 = "Failed to read spectype data at `SPECS` section.";
                  goto LAB_00188421;
                }
                local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
                local_2a8._M_string_length = 0;
                local_2a8.field_2._M_local_buf[0] = '\0';
                sVar8 = Usd_IntegerCompression::DecompressFromBuffer
                                  (local_248._M_dataplus._M_p,(size_t)local_268._M_dataplus._M_p,
                                   (uint32_t *)local_228._M_dataplus._M_p,
                                   (size_t)local_288._M_dataplus._M_p,(string *)&local_2a8,
                                   local_208._M_dataplus._M_p);
                if (sVar8 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream(local_1c8);
                  poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
                  poVar5 = ::std::operator<<(poVar5,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar5 = ::std::operator<<(poVar5,":");
                  poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
                  poVar5 = ::std::operator<<(poVar5,"():");
                  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x17d9);
                  ::std::operator<<(poVar5," ");
                  poVar5 = ::std::operator<<((ostream *)local_1c8,
                                             "Failed to decode fieldset indices at `SPECS` section.\n"
                                            );
                  ::std::operator<<(poVar5,"\n");
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::append((string *)&this->_err);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
                }
                else {
                  pSVar13 = &((this_00->
                              super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                              )._M_impl.super__Vector_impl_data._M_start)->spec_type;
                  for (pcVar7 = (pointer)0x0; local_288._M_dataplus._M_p != pcVar7;
                      pcVar7 = pcVar7 + 1) {
                    *pSVar13 = *(SpecType *)(local_228._M_dataplus._M_p + (long)pcVar7 * 4);
                    pSVar13 = pSVar13 + 3;
                  }
                }
                ::std::__cxx11::string::_M_dispose();
                if (sVar8 == 0) goto LAB_0018846d;
                uVar6 = this->_memoryUsage;
                sVar8 = __new_size;
                if (__new_size <= uVar6) {
                  sVar8 = 0;
                }
                uVar9 = uVar6 - sVar8;
                sVar8 = 0;
                if (uVar9 < __new_size_00) {
                  sVar8 = __new_size_00;
                }
                uVar10 = uVar9 - sVar8;
                if (uVar9 < __new_size_00 || __new_size > uVar6) {
                  this->_memoryUsage = uVar10;
                }
                bVar4 = true;
                if (uVar10 < (ulong)((long)local_288._M_dataplus._M_p * 4)) {
                  this->_memoryUsage = uVar10 + (long)local_288._M_dataplus._M_p * -4;
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_1c8);
                poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
                poVar5 = ::std::operator<<(poVar5,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                          );
                poVar5 = ::std::operator<<(poVar5,":");
                poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
                poVar5 = ::std::operator<<(poVar5,"():");
                poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1781);
                ::std::operator<<(poVar5," ");
                pcVar15 = "Failed to read path indexes size at `SPECS` section.";
LAB_00188421:
                poVar5 = ::std::operator<<((ostream *)local_1c8,pcVar15);
                ::std::operator<<(poVar5,"\n");
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::append((string *)&this->_err);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
LAB_0018846d:
                bVar4 = false;
              }
              std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                        ((_Vector_base<char,_std::allocator<char>_> *)&local_208);
            }
            ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_228);
LAB_00188489:
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                      ((_Vector_base<char,_std::allocator<char>_> *)&local_248);
            return bVar4;
          }
          ::std::__cxx11::ostringstream::ostringstream(local_1c8);
          poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,"[Crate]");
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
          poVar5 = ::std::operator<<(poVar5,"():");
          iVar14 = 0x176d;
        }
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,iVar14);
        ::std::operator<<(poVar5," ");
        pcVar15 = "Reached to max memory budget.";
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1c8);
      poVar5 = ::std::operator<<((ostream *)local_1c8,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ReadSpecs");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1752);
      ::std::operator<<(poVar5," ");
      pcVar15 = "Failed to read # of specs size at `SPECS` section.";
    }
  }
LAB_00187690:
  poVar5 = ::std::operator<<((ostream *)local_1c8,pcVar15);
  ::std::operator<<(poVar5,"\n");
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
LAB_001876d7:
  ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
  return false;
}

Assistant:

bool CrateReader::ReadSpecs() {
  if ((_specs_index < 0) || (_specs_index >= int64_t(_toc.sections.size()))) {
    PUSH_ERROR("Invalid index for `SPECS` section.");
    return false;
  }

  if ((_version[0] == 0) && (_version[1] < 4)) {
    PUSH_ERROR("Version must be 0.4.0 or later, but got " +
               std::to_string(_version[0]) + "." + std::to_string(_version[1]) +
               "." + std::to_string(_version[2]));
    return false;
  }

  const crate::Section &s = _toc.sections[size_t(_specs_index)];

  if (!_sr->seek_set(uint64_t(s.start))) {
    PUSH_ERROR("Failed to move to `SPECS` section.");
    return false;
  }

  uint64_t num_specs;
  if (!_sr->read8(&num_specs)) {
    PUSH_ERROR("Failed to read # of specs size at `SPECS` section.");
    return false;
  }

  if (num_specs > _config.maxNumSpecifiers) {
    PUSH_ERROR("Too many specs in `SPECS` section.");
    return false;
  }

  if (num_specs == 0) {
    // At least 1 Spec(Root Prim '/') must exist.
    PUSH_ERROR("`SPECS` is empty.");
    return false;
  }

  DCOUT("num_specs " << num_specs);

  CHECK_MEMORY_USAGE(size_t(num_specs) * sizeof(Spec));

  _specs.resize(static_cast<size_t>(num_specs));

  // TODO: Memory size check

  // Create temporary space for decompressing.
  size_t compBufferSize= Usd_IntegerCompression::GetCompressedBufferSize(
      static_cast<size_t>(num_specs));

  CHECK_MEMORY_USAGE(compBufferSize);

  std::vector<char> comp_buffer;
  comp_buffer.resize(compBufferSize);

  CHECK_MEMORY_USAGE(size_t(num_specs) * sizeof(uint32_t)); // tmp

  std::vector<uint32_t> tmp(static_cast<size_t>(num_specs));

  size_t workBufferSize= Usd_IntegerCompression::GetDecompressionWorkingSpaceSize(
          static_cast<size_t>(num_specs));

  CHECK_MEMORY_USAGE(workBufferSize);
  std::vector<char> working_space;
  working_space.resize(workBufferSize);

  // path indices
  {
    uint64_t path_indexes_size;
    if (!_sr->read8(&path_indexes_size)) {
      PUSH_ERROR("Failed to read path indexes size at `SPECS` section.");
      return false;
    }

    if (path_indexes_size > comp_buffer.size()) {
      // Maybe corrupted?
      path_indexes_size = comp_buffer.size();
    }

    if (path_indexes_size !=
        _sr->read(size_t(path_indexes_size), size_t(path_indexes_size),
                  reinterpret_cast<uint8_t *>(comp_buffer.data()))) {
      PUSH_ERROR("Failed to read path indexes data at `SPECS` section.");
      return false;
    }

    std::string err;  // not used
    if (!Usd_IntegerCompression::DecompressFromBuffer(
            comp_buffer.data(), size_t(path_indexes_size), tmp.data(),
            size_t(num_specs), &err, working_space.data())) {
      PUSH_ERROR("Failed to decode pathIndexes at `SPECS` section.");
      return false;
    }

    for (size_t i = 0; i < num_specs; ++i) {
      DCOUT("spec[" << i << "].path_index = " << tmp[i]);
      _specs[i].path_index.value = tmp[i];
    }
  }

  // fieldset indices
  {
    uint64_t fset_indexes_size;
    if (!_sr->read8(&fset_indexes_size)) {
      PUSH_ERROR("Failed to read fieldset indexes size at `SPECS` section.");
      return false;
    }

    if (fset_indexes_size > comp_buffer.size()) {
      // Maybe corrupted?
      fset_indexes_size = comp_buffer.size();
    }

    if (fset_indexes_size !=
        _sr->read(size_t(fset_indexes_size), size_t(fset_indexes_size),
                  reinterpret_cast<uint8_t *>(comp_buffer.data()))) {
      PUSH_ERROR("Failed to read fieldset indexes data at `SPECS` section.");
      return false;
    }

    std::string err;  // not used
    if (!Usd_IntegerCompression::DecompressFromBuffer(
            comp_buffer.data(), size_t(fset_indexes_size), tmp.data(),
            size_t(num_specs), &err, working_space.data())) {
      PUSH_ERROR("Failed to decode fieldset indices at `SPECS` section.");
      return false;
    }

    for (size_t i = 0; i != num_specs; ++i) {
      DCOUT("specs[" << i << "].fieldset_index = " << tmp[i]);
      _specs[i].fieldset_index.value = tmp[i];
    }
  }

  // spec types
  {
    uint64_t spectype_size;
    if (!_sr->read8(&spectype_size)) {
      PUSH_ERROR("Failed to read spectype size at `SPECS` section.");
      return false;
    }

    if (spectype_size > comp_buffer.size()) {
      // Maybe corrupted?
      spectype_size = comp_buffer.size();
    }

    if (spectype_size !=
        _sr->read(size_t(spectype_size), size_t(spectype_size),
                  reinterpret_cast<uint8_t *>(comp_buffer.data()))) {
      PUSH_ERROR("Failed to read spectype data at `SPECS` section.");
      return false;
    }

    std::string err;  // not used.
    if (!Usd_IntegerCompression::DecompressFromBuffer(
            comp_buffer.data(), size_t(spectype_size), tmp.data(),
            size_t(num_specs), &err, working_space.data())) {
      PUSH_ERROR("Failed to decode fieldset indices at `SPECS` section.\n");
      return false;
    }

    for (size_t i = 0; i != num_specs; ++i) {
      // std::cout << "spectype = " << tmp[i] << "\n";
      _specs[i].spec_type = static_cast<SpecType>(tmp[i]);
    }
  }

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  for (size_t i = 0; i != num_specs; ++i) {
    DCOUT("spec[" << i << "].pathIndex  = " << _specs[i].path_index.value
                  << ", fieldset_index = " << _specs[i].fieldset_index.value
                  << ", spec_type = "
                  << tinyusdz::to_string(_specs[i].spec_type));
    if (auto specstr = GetSpecString(crate::Index(uint32_t(i)))) {
      DCOUT("spec[" << i << "] string_repr = " << specstr.value());
    }
  }
#endif

  REDUCE_MEMORY_USAGE(compBufferSize);
  REDUCE_MEMORY_USAGE(workBufferSize);
  REDUCE_MEMORY_USAGE(size_t(num_specs) * sizeof(uint32_t)); // tmp

  return true;
}